

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON_TextureCoordinates * __thiscall
ON_ClassArray<ON_TextureCoordinates>::SetCapacity
          (ON_ClassArray<ON_TextureCoordinates> *this,size_t new_capacity)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint local_2c;
  int local_1c;
  int capacity;
  int i;
  size_t new_capacity_local;
  ON_ClassArray<ON_TextureCoordinates> *this_local;
  
  if (this->m_capacity == 0) {
    this->m_a = (ON_TextureCoordinates *)0x0;
    this->m_count = 0;
  }
  if ((new_capacity == 0) || (0xfffffffe < new_capacity)) {
    local_2c = 0;
  }
  else {
    local_2c = (uint)new_capacity;
  }
  if ((int)local_2c < 1) {
    if (this->m_a != (ON_TextureCoordinates *)0x0) {
      local_1c = this->m_capacity;
      while (local_1c = local_1c + -1, -1 < local_1c) {
        DestroyElement(this,this->m_a + local_1c);
      }
      (*this->_vptr_ON_ClassArray[4])(this,this->m_a,0);
      this->m_a = (ON_TextureCoordinates *)0x0;
    }
    this->m_count = 0;
    this->m_capacity = 0;
  }
  else if (this->m_capacity < (int)local_2c) {
    iVar1 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)local_2c);
    this->m_a = (ON_TextureCoordinates *)CONCAT44(extraout_var,iVar1);
    if (this->m_a == (ON_TextureCoordinates *)0x0) {
      this->m_capacity = 0;
      this->m_count = 0;
    }
    else {
      memset(this->m_a + this->m_capacity,0,(long)(int)(local_2c - this->m_capacity) * 0xb8);
      for (local_1c = this->m_capacity; local_1c < (int)local_2c; local_1c = local_1c + 1) {
        ConstructDefaultElement(this,this->m_a + local_1c);
      }
      this->m_capacity = local_2c;
    }
  }
  else if ((int)local_2c < this->m_capacity) {
    local_1c = this->m_capacity;
    while (local_1c = local_1c + -1, (int)local_2c <= local_1c) {
      DestroyElement(this,this->m_a + local_1c);
    }
    if ((int)local_2c < this->m_count) {
      this->m_count = local_2c;
    }
    this->m_capacity = local_2c;
    iVar1 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)local_2c);
    this->m_a = (ON_TextureCoordinates *)CONCAT44(extraout_var_00,iVar1);
    if (this->m_a == (ON_TextureCoordinates *)0x0) {
      this->m_capacity = 0;
      this->m_count = 0;
    }
  }
  return this->m_a;
}

Assistant:

T* ON_ClassArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }
  // uses "placement" for class construction/destruction
  int i;
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX)
               ? (int)new_capacity 
               : 0;

  if ( capacity <= 0 ) {
    if ( m_a ) {
      for ( i = m_capacity-1; i >= 0; i-- ) {
        DestroyElement(m_a[i]);
      }
      Realloc(m_a,0);
      m_a = 0;
    }
    m_count = 0;
    m_capacity = 0;
  }
  else if ( m_capacity < capacity ) {
    // growing
    m_a = Realloc( m_a, capacity );
    // initialize new elements with default constructor
    if ( 0 != m_a )
    {
      // even when m_a is an array of classes with vtable pointers,
      // this call to memset(..., 0, ...) is what I want to do
      // because in-place construction will be used when needed
      // on this memory.
      memset( (void*)(m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
      for ( i = m_capacity; i < capacity; i++ ) {
        ConstructDefaultElement(&m_a[i]);
      }
      m_capacity = capacity;
    }
    else
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  else if ( m_capacity > capacity ) {
    // shrinking
    for ( i = m_capacity-1; i >= capacity; i-- ) {
      DestroyElement(m_a[i]);
    }
    if ( m_count > capacity )
      m_count = capacity;
    m_capacity = capacity;
    m_a = Realloc( m_a, capacity );
    if ( 0 == m_a )
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  return m_a;
}